

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AddColumn(Parse *pParse,Token *pName)

{
  byte bVar1;
  short sVar2;
  Table *pTVar3;
  sqlite3 *db;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  byte *p;
  Column *pCVar7;
  ulong uVar8;
  uchar *b;
  
  pTVar3 = pParse->pNewTable;
  if (pTVar3 != (Table *)0x0) {
    db = pParse->db;
    if (db->aLimit[2] <= (int)pTVar3->nCol) {
      sqlite3ErrorMsg(pParse,"too many columns on %s",pTVar3->zName);
      return;
    }
    p = (byte *)sqlite3NameFromToken(db,pName);
    if (p != (byte *)0x0) {
      uVar6 = (uint)pTVar3->nCol;
      if (0 < pTVar3->nCol) {
        uVar8 = 0;
        do {
          pbVar4 = (byte *)pTVar3->aCol[uVar8].zName;
          if (""[*p] == ""[*pbVar4]) {
            bVar1 = p[1];
            pbVar5 = p + 2;
            while ((pbVar4 = pbVar4 + 1, bVar1 != 0 && (""[bVar1] == ""[*pbVar4]))) {
              bVar1 = *pbVar5;
              pbVar5 = pbVar5 + 1;
            }
            if (""[bVar1] == ""[*pbVar4]) {
              sqlite3ErrorMsg(pParse,"duplicate column name: %s",p);
              sqlite3DbFree(db,p);
              return;
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar6);
      }
      if ((uVar6 & 7) == 0) {
        pCVar7 = (Column *)sqlite3DbRealloc(db,pTVar3->aCol,(long)(int)uVar6 * 0x30 + 0x180);
        if (pCVar7 == (Column *)0x0) {
          sqlite3DbFree(db,p);
          return;
        }
        pTVar3->aCol = pCVar7;
      }
      pCVar7 = pTVar3->aCol;
      sVar2 = pTVar3->nCol;
      pCVar7[sVar2].zName = (char *)0x0;
      pCVar7[sVar2].pDflt = (Expr *)0x0;
      pCVar7[sVar2].zColl = (char *)0x0;
      (&pCVar7[sVar2].zColl)[1] = (char *)0x0;
      pCVar7[sVar2].zDflt = (char *)0x0;
      (&pCVar7[sVar2].zDflt)[1] = (char *)0x0;
      pCVar7[sVar2].zName = (char *)p;
      pCVar7[sVar2].affinity = 'A';
      pCVar7[sVar2].szEst = '\x01';
      pTVar3->nCol = pTVar3->nCol + 1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddColumn(Parse *pParse, Token *pName){
  Table *p;
  int i;
  char *z;
  Column *pCol;
  sqlite3 *db = pParse->db;
  if( (p = pParse->pNewTable)==0 ) return;
#if SQLITE_MAX_COLUMN
  if( p->nCol+1>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns on %s", p->zName);
    return;
  }
#endif
  z = sqlite3NameFromToken(db, pName);
  if( z==0 ) return;
  for(i=0; i<p->nCol; i++){
    if( STRICMP(z, p->aCol[i].zName) ){
      sqlite3ErrorMsg(pParse, "duplicate column name: %s", z);
      sqlite3DbFree(db, z);
      return;
    }
  }
  if( (p->nCol & 0x7)==0 ){
    Column *aNew;
    aNew = sqlite3DbRealloc(db,p->aCol,(p->nCol+8)*sizeof(p->aCol[0]));
    if( aNew==0 ){
      sqlite3DbFree(db, z);
      return;
    }
    p->aCol = aNew;
  }
  pCol = &p->aCol[p->nCol];
  memset(pCol, 0, sizeof(p->aCol[0]));
  pCol->zName = z;
 
  /* If there is no type specified, columns have the default affinity
  ** 'NONE'. If there is a type specified, then sqlite3AddColumnType() will
  ** be called next to set pCol->affinity correctly.
  */
  pCol->affinity = SQLITE_AFF_NONE;
  pCol->szEst = 1;
  p->nCol++;
}